

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O3

void Omega_h::any::vtable_dynamic<Omega_h::NameValue>::destroy(storage_union *storage)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)storage->dynamic;
  if (puVar1 != (undefined8 *)0x0) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[5] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[5]);
    }
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
  }
  operator_delete(puVar1,0x30);
  return;
}

Assistant:

static void destroy(storage_union& storage) noexcept {
      // assert(reinterpret_cast<T*>(storage.dynamic));
      delete reinterpret_cast<T*>(storage.dynamic);
    }